

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O1

int __thiscall lan::db::connect(db *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  long lVar1;
  int iVar2;
  int __oflag;
  undefined4 in_register_00000034;
  long *local_38 [2];
  long local_28 [2];
  
  lVar1 = *(long *)CONCAT44(in_register_00000034,__fd);
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_38,lVar1,((long *)CONCAT44(in_register_00000034,__fd))[1] + lVar1);
  iVar2 = safe_file::open(&this->file,(char *)local_38,__oflag);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return iVar2;
}

Assistant:

bool db::connect(std::string filename){
            return file.open(filename);
        }